

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
skiwi::(anonymous_namespace)::make_let_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,int nr_args)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> temp;
  allocator<char> local_25a;
  allocator<char> local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [64];
  string local_1f8 [32];
  string local_1d8 [32];
  allocator<char> local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_238,"x",local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_238 + 0x20),"y",(allocator<char> *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"z",&local_259);
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"w",&local_25a);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  uVar3 = (ulong)this & 0xffffffff;
  if ((int)this < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0x20 != uVar2; uVar2 = uVar2 + 0x20) {
    g_alpha_conversion_index = g_alpha_conversion_index + 1;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar1 = std::operator<<(local_1a8,(string *)(local_238 + uVar2));
    poVar1 = std::operator<<(poVar1,"_");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
  }
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *)local_238);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> make_let_names(int nr_args)
    {
    assert(nr_args <= 4);
    std::array<std::string, 4> temp = { {"x", "y", "z", "w"} };
    std::vector<std::string> let_names;
    for (int i = 0; i < nr_args; ++i)
      {
      let_names.push_back(make_name(temp[i], g_alpha_conversion_index++));
      }
    return let_names;
    }